

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int __thiscall
fmt::v5::internal::
arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
::init(arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
       *this,EVP_PKEY_CTX *ctx)

{
  undefined8 *puVar1;
  int iVar2;
  int in_EAX;
  entry *peVar3;
  long lVar4;
  uint i_1;
  uint uVar5;
  ulong uVar6;
  uint i;
  ulong uVar7;
  ulong uVar8;
  value<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
  val;
  
  if (this->map_ != (entry *)0x0) {
    return in_EAX;
  }
  uVar6 = *(ulong *)ctx;
  uVar7 = 0xf;
  if ((long)uVar6 < 0) {
    uVar7 = uVar6;
  }
  uVar8 = (uVar7 & 0xffffffff) * 0x30;
  peVar3 = (entry *)operator_new__(uVar8);
  if ((int)uVar7 != 0) {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)&(peVar3->arg).type_ + lVar4) = 0;
      *(undefined4 *)((long)&(peVar3->arg).value_.field_0 + lVar4) = 0;
      puVar1 = (undefined8 *)((long)&(peVar3->name).data_ + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar4 = lVar4 + 0x30;
    } while (uVar8 - lVar4 != 0);
  }
  this->map_ = peVar3;
  uVar5 = 0;
  if ((long)uVar6 < 0) {
    do {
      uVar8 = *(ulong *)(ctx + 8);
      iVar2 = *(int *)(uVar8 + 0x10 + (ulong)uVar5 * 0x20);
      if (iVar2 == 1) {
        push_back(this,(value<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
                        )((anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>_1
                           *)(uVar8 + (ulong)uVar5 * 0x20))->string);
      }
      else if (iVar2 == 0) {
LAB_0019bd8c:
        return (int)uVar8;
      }
      uVar5 = uVar5 + 1;
    } while( true );
  }
  uVar7 = 0;
  do {
    uVar8 = (0xfL << ((byte)uVar5 & 0x3f) & uVar6) >> ((byte)uVar5 & 0x3f);
    if ((int)uVar8 == 1) {
      val.field_0.string.size = *(undefined8 *)(*(long *)(ctx + 8) + 8 + uVar7 * 0x10);
      val.field_0.long_long_value = *(undefined8 *)(*(long *)(ctx + 8) + uVar7 * 0x10);
      push_back(this,val);
      uVar6 = *(ulong *)ctx;
    }
    else if ((int)uVar8 == 0) goto LAB_0019bd8c;
    uVar7 = (ulong)((int)uVar7 + 1);
    uVar5 = uVar5 + 4;
  } while( true );
}

Assistant:

void arg_map<Context>::init(const basic_format_args<Context> &args) {
  if (map_)
    return;
  map_ = new entry[args.max_size()];
  if (args.is_packed()) {
    for (unsigned i = 0;/*nothing*/; ++i) {
      internal::type arg_type = args.type(i);
      switch (arg_type) {
        case internal::none_type:
          return;
        case internal::named_arg_type:
          push_back(args.values_[i]);
          break;
        default:
          break; // Do nothing.
      }
    }
  }
  for (unsigned i = 0; ; ++i) {
    switch (args.args_[i].type_) {
      case internal::none_type:
        return;
      case internal::named_arg_type:
        push_back(args.args_[i].value_);
        break;
      default:
        break; // Do nothing.
    }
  }
}